

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::AllocateExternalObject_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ScriptContext *pSVar1;
  JsRTVarsArgumentAction_InternalUse<1UL> *pJVar2;
  Var pvVar3;
  Var local_30;
  Var res;
  
  pSVar1 = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (pSVar1 != (ScriptContext *)0x0) {
    pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)36>
                       (evt);
    pvVar3 = InflateVarInReplay(executeContext,pJVar2->VarArray[0]);
    local_30 = (Var)0x0;
    (*(executeContext->TTDExternalObjectFunctions).pfCreateExternalObject)(pSVar1,pvVar3,&local_30);
    JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)36>
              (executeContext,evt,local_30);
    return;
  }
  TTDAbort_unrecoverable_error("This should be non-null!!!");
}

Assistant:

void AllocateExternalObject_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::AllocateExternalObjectActionTag>(evt);
            Js::Var prototype = InflateVarInReplay(executeContext, GetVarItem_0(action));

            Js::Var res = nullptr;
            executeContext->TTDExternalObjectFunctions.pfCreateExternalObject(ctx, prototype, &res);

            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::AllocateExternalObjectActionTag>(executeContext, evt, res);
        }